

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_refs.c
# Opt level: O2

HEVCFrame * alloc_frame(HEVCContext *s)

{
  MppFrameFormat MVar1;
  int iVar2;
  HEVCFrame *pHVar3;
  MPP_RET MVar4;
  H265dContext_t *pHVar5;
  MppFrameFormat MVar6;
  HEVCFrame *pHVar7;
  long lVar8;
  RK_U32 RVar9;
  MppFrameFormat MVar10;
  MppFrameColorTransferCharacteristic v;
  
  pHVar5 = s->h265dctx;
  MVar1 = (pHVar5->cfg->base).out_fmt;
  lVar8 = 0x12;
  pHVar3 = (HEVCFrame *)(s->rps[4].isLongTerm + 6);
  do {
    pHVar7 = pHVar3;
    lVar8 = lVar8 + -1;
    if (lVar8 == 0) {
      _mpp_log_l(2,"H265_PARSER_REF","Error allocating frame, DPB full.\n",(char *)0x0);
      return (HEVCFrame *)0x0;
    }
    pHVar3 = pHVar7 + 1;
  } while (pHVar7[1].slot_index != 0xff);
  if (((byte)h265d_debug & 0x40) != 0) {
    _mpp_log_l(4,"H265_PARSER_REF","width = %d height = %d",(char *)0x0,(ulong)(uint)pHVar5->width,
               (ulong)(uint)pHVar5->height);
    pHVar5 = s->h265dctx;
  }
  mpp_frame_set_width(pHVar3->frame,pHVar5->width);
  mpp_frame_set_height(pHVar3->frame,s->h265dctx->height);
  mpp_frame_set_hor_stride
            (pHVar3->frame,
             (s->h265dctx->coded_width + 0x3fU & 0xffffffc0) * s->h265dctx->nBitDepth >> 3);
  mpp_frame_set_ver_stride(pHVar3->frame,s->h265dctx->coded_height);
  MVar6 = s->h265dctx->pix_fmt & 0xfffff;
  MVar10 = MVar6 + 0x4000000;
  if (s->is_hdr == 0) {
    MVar10 = MVar6;
  }
  MVar10 = MVar10 | MVar1 & 0xfff00000;
  s->h265dctx->pix_fmt = MVar10;
  mpp_frame_set_fmt(pHVar3->frame,MVar10);
  pHVar5 = s->h265dctx;
  if ((pHVar5->pix_fmt & 0xf00000) == 0) {
    if (((((pHVar5->pix_fmt >> 0x19 & 1) == 0) && (((pHVar5->cfg->base).enable_vproc & 2) != 0)) &&
        (pHVar5->width < 0x781)) && (pHVar5->height < 0x441)) {
      mpp_frame_set_mode(pHVar3->frame,0xc);
    }
  }
  else {
    iVar2 = pHVar5->width;
    mpp_slots_set_prop(s->slots,SLOTS_HOR_ALIGN,hor_align_64);
    mpp_frame_set_offset_x(pHVar3->frame,0);
    mpp_frame_set_offset_y(pHVar3->frame,4);
    if (*compat_ext_fbc_buf_size != 0) {
      mpp_frame_set_ver_stride(pHVar3->frame,s->h265dctx->coded_height + 0x10);
    }
    if (*compat_ext_fbc_hdr_256_odd == 0) {
      RVar9 = iVar2 + 0x3fU & 0xffffffc0;
    }
    else {
      RVar9 = s->h265dctx->width + 0xffU & 0xfffffe00 | 0x100;
    }
    mpp_frame_set_fbc_hdr_stride(pHVar3->frame,RVar9);
  }
  RVar9 = (s->h265dctx->cfg->base).enable_thumbnail;
  if ((RVar9 == 0) || ((s->h265dctx->hw_info->field_0x6 & 8) == 0)) {
    RVar9 = 0;
  }
  mpp_frame_set_thumbnail_en(pHVar3->frame,RVar9);
  mpp_frame_set_errinfo(pHVar3->frame,0);
  mpp_frame_set_pts(pHVar3->frame,s->pts);
  mpp_frame_set_poc(pHVar3->frame,s->poc);
  mpp_frame_set_color_range(pHVar3->frame,s->h265dctx->color_range);
  mpp_frame_set_color_primaries(pHVar3->frame,(uint)(s->sps->vui).colour_primaries);
  if ((s->alternative_transfer).present == 0) {
    v = (MppFrameColorTransferCharacteristic)(s->sps->vui).transfer_characteristic;
  }
  else {
    v = (s->alternative_transfer).preferred_transfer_characteristics;
  }
  mpp_frame_set_color_trc(pHVar3->frame,v);
  mpp_frame_set_colorspace(pHVar3->frame,s->h265dctx->colorspace);
  mpp_frame_set_mastering_display(pHVar3->frame,s->mastering_display);
  mpp_frame_set_content_light(pHVar3->frame,s->content_light);
  if (((byte)h265d_debug & 0x40) != 0) {
    _mpp_log_l(4,"H265_PARSER_REF","poc %d w_stride %d h_stride %d\n",(char *)0x0,
               (ulong)(uint)s->poc,(ulong)(uint)s->h265dctx->coded_width,s->h265dctx->coded_height);
  }
  MVar4 = mpp_buf_slot_get_unused(s->slots,&pHVar7[1].slot_index);
  if ((MVar4 != MPP_OK) &&
     (_mpp_log_l(2,"H265_PARSER_REF","Assertion %s failed at %s:%d\n",(char *)0x0,"ret == MPP_OK",
                 "alloc_frame",0x97), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  return pHVar3;
}

Assistant:

static HEVCFrame *alloc_frame(HEVCContext *s)
{
    RK_U32  i;
    MPP_RET ret = MPP_OK;
    MppFrameFormat fmt = s->h265dctx->cfg->base.out_fmt & (~MPP_FRAME_FMT_MASK);

    for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
        HEVCFrame *frame = &s->DPB[i];
        if (frame->slot_index != 0xff) {
            continue;
        }

        h265d_dbg(H265D_DBG_GLOBAL, "width = %d height = %d", s->h265dctx->width, s->h265dctx->height);
        mpp_frame_set_width(frame->frame, s->h265dctx->width);
        mpp_frame_set_height(frame->frame, s->h265dctx->height);
        mpp_frame_set_hor_stride(frame->frame,
                                 (MPP_ALIGN(s->h265dctx->coded_width, 64) * s->h265dctx->nBitDepth) >> 3);
        mpp_frame_set_ver_stride(frame->frame, s->h265dctx->coded_height);
        s->h265dctx->pix_fmt &= MPP_FRAME_FMT_MASK;
        if (s->is_hdr) {
            s->h265dctx->pix_fmt |= MPP_FRAME_HDR;
        }
        s->h265dctx->pix_fmt |= fmt;
        mpp_frame_set_fmt(frame->frame, s->h265dctx->pix_fmt);

        if (MPP_FRAME_FMT_IS_FBC(s->h265dctx->pix_fmt)) {
            RK_U32 fbc_hdr_stride = MPP_ALIGN(s->h265dctx->width, 64);

            mpp_slots_set_prop(s->slots, SLOTS_HOR_ALIGN, hor_align_64);
            mpp_frame_set_offset_x(frame->frame, 0);
            mpp_frame_set_offset_y(frame->frame, 4);

            if (*compat_ext_fbc_buf_size)
                mpp_frame_set_ver_stride(frame->frame, s->h265dctx->coded_height + 16);

            if (*compat_ext_fbc_hdr_256_odd)
                fbc_hdr_stride = MPP_ALIGN(s->h265dctx->width, 256) | 256;

            mpp_frame_set_fbc_hdr_stride(frame->frame, fbc_hdr_stride);
        } else if (MPP_FRAME_FMT_IS_TILE(s->h265dctx->pix_fmt)) {
            /* nothing todo */
        } else {
            if ((s->h265dctx->cfg->base.enable_vproc & MPP_VPROC_MODE_DETECTION) &&
                s->h265dctx->width <= 1920 &&  s->h265dctx->height <= 1088)
                mpp_frame_set_mode(frame->frame, MPP_FRAME_FLAG_DEINTERLACED);
        }

        if (s->h265dctx->cfg->base.enable_thumbnail && s->h265dctx->hw_info->cap_down_scale)
            mpp_frame_set_thumbnail_en(frame->frame, s->h265dctx->cfg->base.enable_thumbnail);
        else
            mpp_frame_set_thumbnail_en(frame->frame, 0);

        mpp_frame_set_errinfo(frame->frame, 0);
        mpp_frame_set_pts(frame->frame, s->pts);
        mpp_frame_set_poc(frame->frame, s->poc);
        mpp_frame_set_color_range(frame->frame, s->h265dctx->color_range);
        mpp_frame_set_color_primaries(frame->frame, s->sps->vui.colour_primaries);
        if (s->alternative_transfer.present)
            mpp_frame_set_color_trc(frame->frame,
                                    s->alternative_transfer.preferred_transfer_characteristics);
        else
            mpp_frame_set_color_trc(frame->frame, s->sps->vui.transfer_characteristic);
        mpp_frame_set_colorspace(frame->frame, s->h265dctx->colorspace);
        mpp_frame_set_mastering_display(frame->frame, s->mastering_display);
        mpp_frame_set_content_light(frame->frame, s->content_light);

        h265d_dbg(H265D_DBG_GLOBAL, "poc %d w_stride %d h_stride %d\n",
                  s->poc, s->h265dctx->coded_width, s->h265dctx->coded_height);
        ret = mpp_buf_slot_get_unused(s->slots, &frame->slot_index);
        mpp_assert(ret == MPP_OK);
        return frame;
    }
    mpp_err( "Error allocating frame, DPB full.\n");
    return NULL;
}